

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasis(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  pointer pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  bool bVar4;
  Status SVar5;
  int iVar6;
  uint i_00;
  uint i_01;
  Type TVar7;
  ostream *poVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  double *pdVar10;
  char cVar11;
  byte bVar12;
  int i;
  long lVar13;
  int i_1;
  int iVar14;
  NameSet *pNVar15;
  long lVar16;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  NameSet *local_478;
  NameSet *local_470;
  Desc l_desc;
  cpp_dec_float<200U,_int,_void> local_410;
  stringstream name;
  istream *local_380;
  undefined8 local_378;
  undefined2 local_370;
  char *local_268;
  char *pcStack_260;
  char *local_258;
  char *pcStack_250;
  char *local_248;
  char *pcStack_240;
  char local_238;
  char local_138;
  undefined2 local_38;
  int local_34;
  
  p_colNames = (NameSet *)0x0;
  p_rowNames = (NameSet *)0x0;
  local_478 = colNames;
  local_470 = rowNames;
  if (colNames == (NameSet *)0x0) {
    iVar6 = (this->theLP->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)&name);
    spx_alloc<soplex::NameSet*>(&p_colNames,1);
    pNVar15 = p_colNames;
    NameSet::NameSet(p_colNames,10000,-1,2.0,2.0);
    p_colNames = pNVar15;
    NameSet::reMax(pNVar15,iVar6);
    iVar14 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; iVar6 != iVar14; iVar14 = iVar14 + 1) {
      poVar8 = std::operator<<((ostream *)&local_380,"x");
      std::ostream::operator<<((ostream *)poVar8,iVar14);
      l_desc.rowstat._0_8_ =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::cId(&this->theLP->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,iVar14);
      pNVar15 = p_colNames;
      std::__cxx11::stringbuf::str();
      NameSet::add(pNVar15,(DataKey *)&l_desc,(char *)local_410.data._M_elems._0_8_);
      std::__cxx11::string::~string((string *)&local_410);
    }
    local_478 = p_colNames;
    std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  }
  pNVar15 = local_470;
  if (local_470 == (NameSet *)0x0) {
    iVar6 = (this->theLP->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)&name);
    spx_alloc<soplex::NameSet*>(&p_rowNames,1);
    pNVar15 = p_rowNames;
    NameSet::NameSet(p_rowNames,10000,-1,2.0,2.0);
    p_rowNames = pNVar15;
    NameSet::reMax(pNVar15,iVar6);
    iVar14 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; pNVar15 = p_rowNames, iVar6 != iVar14; iVar14 = iVar14 + 1) {
      poVar8 = std::operator<<((ostream *)&local_380,"C");
      std::ostream::operator<<((ostream *)poVar8,iVar14);
      l_desc.rowstat._0_8_ =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rId(&this->theLP->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,iVar14);
      pNVar15 = p_rowNames;
      std::__cxx11::stringbuf::str();
      NameSet::add(pNVar15,(DataKey *)&l_desc,(char *)local_410.data._M_elems._0_8_);
      std::__cxx11::string::~string((string *)&local_410);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  }
  if (this->thestatus == NO_PROBLEM) {
    (*this->_vptr_SPxBasisBase[7])(this,this->theLP,0);
  }
  Desc::Desc(&l_desc,&this->thedesc);
  for (lVar13 = 0; pSVar9 = this->theLP,
      lVar13 < (pSVar9->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar13 = lVar13 + 1) {
    SVar5 = dualRowStatus(this,(int)lVar13);
    l_desc.rowstat.data[lVar13] = SVar5;
  }
  lVar16 = 0;
  for (lVar13 = 0;
      lVar13 < (pSVar9->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar13 = lVar13 + 1) {
    bVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)(((pSVar9->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .low.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                 _M_elems + lVar16),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)(((pSVar9->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                 _M_elems + lVar16));
    if (bVar2) {
      l_desc.colstat.data[lVar13] = P_FIXED;
    }
    else {
      pnVar1 = (this->theLP->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&name,-*pdVar10,(type *)0x0);
      tVar3 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(pnVar1->m_backend).data._M_elems + lVar16),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&name);
      if (tVar3) {
        pnVar1 = (this->theLP->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar10 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_410,*pdVar10,(type *)0x0);
        tVar3 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)(pnVar1->m_backend).data._M_elems + lVar16),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_410);
        if (tVar3) {
          l_desc.colstat.data[lVar13] = P_FREE;
          goto LAB_003c7026;
        }
      }
      pnVar1 = (this->theLP->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&name,-*pdVar10,(type *)0x0);
      tVar3 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)(pnVar1->m_backend).data._M_elems + lVar16),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&name);
      if (tVar3) {
        l_desc.colstat.data[lVar13] = P_ON_UPPER;
      }
      else {
        l_desc.colstat.data[lVar13] = P_ON_LOWER;
      }
    }
LAB_003c7026:
    pSVar9 = this->theLP;
    lVar16 = lVar16 + 0x80;
  }
  _name = &PTR__MPSInput_0053cf70;
  bVar2 = false;
  local_378._0_4_ = 0;
  local_378._4_4_ = MINIMIZE;
  local_370._0_1_ = false;
  local_370._1_1_ = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138 = '\0';
  local_268 = (char *)0x0;
  pcStack_260 = (char *)0x0;
  local_258 = (char *)0x0;
  pcStack_250 = (char *)0x0;
  local_248 = (char *)0x0;
  pcStack_240 = (char *)0x0;
  local_238 = '\0';
  local_380 = is;
  bVar4 = MPSInput::readLine((MPSInput *)&name);
  if ((bVar4) && (local_268 != (char *)0x0)) {
    iVar6 = strcmp(local_268,"NAME");
    if (iVar6 == 0) {
      while( true ) {
        bVar4 = MPSInput::readLine((MPSInput *)&name);
        if (!bVar4) break;
        if (local_268 != (char *)0x0) {
          iVar6 = strcmp(local_268,"ENDATA");
          if (iVar6 == 0) {
            bVar2 = true;
            break;
          }
        }
        if ((pcStack_260 == (char *)0x0) || (local_258 == (char *)0x0)) break;
        i_00 = NameSet::number(local_478,local_258);
        if ((int)i_00 < 0) break;
        cVar11 = *pcStack_260;
        if (cVar11 == 'X') {
          if (pcStack_250 == (char *)0x0) break;
          i_01 = NameSet::number(pNVar15,pcStack_250);
          if ((int)i_01 < 0) break;
          cVar11 = *pcStack_260;
          if (cVar11 != 'X') goto LAB_003c729c;
          if ((pcStack_260[1] == 'U') && (pcStack_260[2] == '\0')) {
            SVar5 = dualColStatus(this,i_00);
            l_desc.colstat.data[i_00] = SVar5;
            TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)this->theLP,i_01);
            if (TVar7 == GREATER_EQUAL) {
              l_desc.rowstat.data[i_01] = P_ON_LOWER;
            }
            else {
              TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)this->theLP,i_01);
              if (TVar7 == EQUAL) {
LAB_003c728f:
                l_desc.rowstat.data[i_01] = P_FIXED;
              }
              else {
                l_desc.rowstat.data[i_01] = P_ON_UPPER;
              }
            }
          }
          else {
            if ((pcStack_260[1] != 'L') || (pcStack_260[2] != '\0')) {
LAB_003c7375:
              MPSInput::syntaxError((MPSInput *)&name);
              break;
            }
            SVar5 = dualColStatus(this,i_00);
            l_desc.colstat.data[i_00] = SVar5;
            TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)this->theLP,i_01);
            if (TVar7 == LESS_EQUAL) {
              l_desc.rowstat.data[i_01] = P_ON_UPPER;
            }
            else {
              TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)this->theLP,i_01);
              if (TVar7 == EQUAL) goto LAB_003c728f;
              l_desc.rowstat.data[i_01] = P_ON_LOWER;
            }
          }
        }
        else {
LAB_003c729c:
          if (cVar11 == 'L') {
            if ((pcStack_260[1] != 'L') || (pcStack_260[2] != '\0')) goto LAB_003c7375;
            l_desc.colstat.data[i_00] = P_ON_LOWER;
          }
          else {
            if (((cVar11 != 'U') || (pcStack_260[1] != 'L')) || (pcStack_260[2] != '\0'))
            goto LAB_003c7375;
            l_desc.colstat.data[i_00] = P_ON_UPPER;
          }
        }
      }
    }
  }
  if (local_370._0_1_ == false) {
    if (bVar2) {
      if (this->thestatus != REGULAR) {
        this->thestatus = REGULAR;
      }
      (*this->_vptr_SPxBasisBase[5])(this,&l_desc);
    }
    else {
      MPSInput::syntaxError((MPSInput *)&name);
    }
  }
  if (local_470 == (NameSet *)0x0) {
    NameSet::~NameSet(p_rowNames);
    free(p_rowNames);
    p_rowNames = (NameSet *)0x0;
  }
  if (colNames == (NameSet *)0x0) {
    NameSet::~NameSet(p_colNames);
    free(p_colNames);
    p_colNames = (NameSet *)0x0;
  }
  bVar12 = local_370._0_1_ ^ 1;
  Desc::~Desc(&l_desc);
  return (bool)bVar12;
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}